

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall capnp::JsonCodec::handleByAnnotation(JsonCodec *this,Schema schema)

{
  Which WVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  Schema *pSVar4;
  Impl *pIVar5;
  Type local_158;
  Schema local_148;
  EnumSchema enumSchema;
  Schema dep;
  Schema *__end4;
  Schema *__begin4;
  Vector<capnp::Schema> *__range4;
  Maybe<kj::StringPtr> local_110;
  Maybe<capnp::json::DiscriminatorOptions::Reader> local_f0;
  Schema local_a8;
  undefined1 local_a0 [8];
  Vector<capnp::Schema> dependencies;
  Reader local_78;
  Reader local_48;
  JsonCodec *local_18;
  JsonCodec *this_local;
  Schema schema_local;
  
  local_18 = this;
  this_local = (JsonCodec *)schema.raw;
  Schema::getProto(&local_48,(Schema *)&this_local);
  WVar1 = capnp::schema::Node::Reader::which(&local_48);
  if (WVar1 == STRUCT) {
    Schema::getProto(&local_78,(Schema *)&this_local);
    uVar2 = capnp::schema::Node::Reader::getId(&local_78);
    uVar3 = typeId<capnp::json::Value,capnp::json::Value::_capnpPrivate>();
    if (uVar2 == uVar3) {
      dependencies.builder.disposer = (ArrayDisposer *)Schema::asStruct((Schema *)&this_local);
      addTypeHandler(this,(StructSchema)dependencies.builder.disposer,
                     &handleByAnnotation::GLOBAL_HANDLER.
                      super_Handler<capnp::DynamicStruct,_(capnp::Style)2>);
    }
    else {
      kj::Vector<capnp::Schema>::Vector((Vector<capnp::Schema> *)local_a0);
      local_a8.raw = (RawBrandedSchema *)Schema::asStruct((Schema *)&this_local);
      kj::Maybe<capnp::json::DiscriminatorOptions::Reader>::Maybe(&local_f0);
      kj::Maybe<kj::StringPtr>::Maybe(&local_110);
      loadAnnotatedHandler
                (this,(StructSchema)local_a8.raw,&local_f0,&local_110,
                 (Vector<capnp::Schema> *)local_a0);
      kj::Maybe<kj::StringPtr>::~Maybe(&local_110);
      kj::Maybe<capnp::json::DiscriminatorOptions::Reader>::~Maybe(&local_f0);
      __end4 = kj::Vector<capnp::Schema>::begin((Vector<capnp::Schema> *)local_a0);
      pSVar4 = kj::Vector<capnp::Schema>::end((Vector<capnp::Schema> *)local_a0);
      for (; __end4 != pSVar4; __end4 = __end4 + 1) {
        enumSchema.super_Schema.raw = (Schema)__end4->raw;
        handleByAnnotation(this,enumSchema.super_Schema);
      }
      kj::Vector<capnp::Schema>::~Vector((Vector<capnp::Schema> *)local_a0);
    }
  }
  else if (WVar1 == ENUM) {
    local_148.raw = (RawBrandedSchema *)Schema::asEnum((Schema *)&this_local);
    pIVar5 = kj::Own<capnp::JsonCodec::Impl,_std::nullptr_t>::operator->(&this->impl);
    local_158.enumSchema = (EnumSchema *)&local_148;
    local_158.this = this;
    kj::HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,decltype(nullptr)>>::
    findOrCreate<capnp::EnumSchema&,capnp::JsonCodec::handleByAnnotation(capnp::Schema)::__0>
              ((HashMap<capnp::Type,kj::Own<capnp::JsonCodec::AnnotatedEnumHandler,decltype(nullptr)>>
                *)&pIVar5->annotatedEnumHandlers,(EnumSchema *)&local_148,&local_158);
  }
  return;
}

Assistant:

void JsonCodec::handleByAnnotation(Schema schema) {
  switch (schema.getProto().which()) {
    case schema::Node::STRUCT: {
      if (schema.getProto().getId() == capnp::typeId<JsonValue>()) {
        // Special handler for JsonValue.
        static JsonValueHandler GLOBAL_HANDLER;
        addTypeHandler(schema.asStruct(), GLOBAL_HANDLER);
      } else {
        kj::Vector<Schema> dependencies;
        loadAnnotatedHandler(schema.asStruct(), kj::none, kj::none, dependencies);
        for (auto dep: dependencies) {
          handleByAnnotation(dep);
        }
      }
      break;
    }
    case schema::Node::ENUM: {
      auto enumSchema = schema.asEnum();
      impl->annotatedEnumHandlers.findOrCreate(enumSchema, [&]() {
        auto handler = kj::heap<AnnotatedEnumHandler>(enumSchema);
        addTypeHandler(enumSchema, *handler);
        return kj::HashMap<Type, kj::Own<AnnotatedEnumHandler>>::Entry {
            enumSchema, kj::mv(handler) };
      });
      break;
    }
    default:
      break;
  }
}